

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O1

void Gia_AigerWrite(Gia_Man_t *pInit,char *pFileName,int fWriteSymbols,int fCompact)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  FILE *__stream;
  Gia_Man_t *p;
  Vec_Int_t *pVVar8;
  Vec_Str_t *pVVar9;
  void *__ptr;
  float *pfVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  uchar *puVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  byte *pbVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  uchar Buffer [5];
  
  if ((pInit->nXors != 0) || (pInit->nMuxes != 0)) {
    __assert_fail("pInit->nXors == 0 && pInit->nMuxes == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                  ,0x441,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
  }
  if (pInit->vCos->nSize == 0) {
    puts("AIG cannot be written because it has no POs.");
    return;
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Gia_AigerWrite(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  iVar4 = Gia_ManIsNormalized(pInit);
  p = pInit;
  if (iVar4 == 0) {
    p = Gia_ManDupNormalize(pInit,0);
    Gia_ManTransferMapping(p,pInit);
    Gia_ManTransferPacking(p,pInit);
    Gia_ManTransferTiming(p,pInit);
    p->vNamesIn = pInit->vNamesIn;
    pInit->vNamesIn = (Vec_Ptr_t *)0x0;
    p->vNamesOut = pInit->vNamesOut;
    pInit->vNamesOut = (Vec_Ptr_t *)0x0;
    p->nConstrs = pInit->nConstrs;
    pInit->nConstrs = 0;
  }
  pcVar14 = "2";
  if (fCompact == 0) {
    pcVar14 = "";
  }
  iVar4 = p->vCis->nSize;
  iVar17 = p->vCos->nSize;
  uVar24 = ~(iVar17 + iVar4) + p->nObjs;
  uVar19 = p->nRegs;
  uVar7 = iVar17 - uVar19;
  if (p->nConstrs != 0) {
    uVar7 = 0;
  }
  fprintf(__stream,"aig%s %u %u %u %u %u",pcVar14,(ulong)(uVar24 + iVar4),(ulong)(iVar4 - uVar19),
          (ulong)uVar19,(ulong)uVar7,(ulong)uVar24);
  if (p->nConstrs != 0) {
    fprintf(__stream," %u %u",(ulong)(uint)(p->vCos->nSize - (p->nRegs + p->nConstrs)));
  }
  fputc(10,__stream);
  Gia_ManInvertConstraints(p);
  if (fCompact == 0) {
    iVar4 = p->nRegs;
    if (0 < iVar4) {
      iVar17 = 0;
      do {
        iVar18 = p->vCos->nSize;
        uVar19 = (iVar18 - iVar4) + iVar17;
        if (((int)uVar19 < 0) || (iVar18 <= (int)uVar19)) goto LAB_00678da8;
        iVar4 = p->vCos->pArray[uVar19];
        if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00678d89;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar19 = *(uint *)(p->pObjs + iVar4);
        iVar4 = iVar4 - (uVar19 & 0x1fffffff);
        if (iVar4 < 0) goto LAB_00678dc7;
        fprintf(__stream,"%u\n",(ulong)((uVar19 >> 0x1d & 1) + iVar4 * 2));
        iVar17 = iVar17 + 1;
        iVar4 = p->nRegs;
      } while (iVar17 < iVar4);
    }
    pVVar8 = p->vCos;
    uVar13 = (ulong)(uint)pVVar8->nSize;
    if (p->nRegs < pVVar8->nSize) {
      lVar15 = 0;
      do {
        if ((int)uVar13 <= lVar15) goto LAB_00678da8;
        iVar4 = pVVar8->pArray[lVar15];
        if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00678d89;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar19 = *(uint *)(p->pObjs + iVar4);
        iVar4 = iVar4 - (uVar19 & 0x1fffffff);
        if (iVar4 < 0) goto LAB_00678dc7;
        fprintf(__stream,"%u\n",(ulong)((uVar19 >> 0x1d & 1) + iVar4 * 2));
        lVar15 = lVar15 + 1;
        pVVar8 = p->vCos;
        uVar13 = (ulong)pVVar8->nSize;
      } while (lVar15 < (long)(uVar13 - (long)p->nRegs));
    }
  }
  else {
    pVVar8 = Gia_AigerCollectLiterals(p);
    pVVar9 = Gia_AigerWriteLiterals(pVVar8);
    pcVar14 = pVVar9->pArray;
    fwrite(pcVar14,1,(long)pVVar9->nSize,__stream);
    if (pcVar14 != (char *)0x0) {
      free(pcVar14);
      pVVar9->pArray = (char *)0x0;
    }
    if (pVVar9 != (Vec_Str_t *)0x0) {
      free(pVVar9);
    }
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      pVVar8->pArray = (int *)0x0;
    }
    if (pVVar8 != (Vec_Int_t *)0x0) {
      free(pVVar8);
    }
  }
  Gia_ManInvertConstraints(p);
  iVar4 = p->nObjs;
  iVar17 = ~(p->vCos->nSize + p->vCis->nSize) + iVar4;
  iVar18 = iVar17 * 8 + 100;
  __ptr = malloc((long)iVar18);
  if ((long)iVar4 < 1) {
LAB_00677d43:
    iVar6 = 0;
  }
  else {
    pGVar1 = p->pObjs;
    lVar15 = 0;
    iVar6 = 0;
    do {
      if (pGVar1 == (Gia_Obj_t *)0x0) goto LAB_00677d43;
      uVar13 = *(ulong *)(pGVar1 + lVar15);
      uVar19 = (uint)uVar13;
      if ((~uVar19 & 0x1fffffff) != 0 && -1 < (int)uVar19) {
        iVar5 = (int)lVar15;
        iVar20 = iVar5 - (uVar19 & 0x1fffffff);
        if (iVar20 < 0) {
LAB_00678dc7:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf1,"int Abc_Var2Lit(int, int)");
        }
        uVar19 = (uint)(uVar13 >> 0x20);
        iVar21 = iVar5 - (uVar19 & 0x1fffffff);
        if (iVar21 < 0) goto LAB_00678dc7;
        uVar7 = ((uint)(uVar13 >> 0x1d) & 1) + iVar20 * 2;
        uVar19 = (uVar19 >> 0x1d & 1) + iVar21 * 2;
        if (((p->fGiaSimple == 0) && (p->nBufs == 0)) && (uVar19 <= uVar7)) {
          __assert_fail("p->fGiaSimple || Gia_ManBufNum(p) || uLit0 < uLit1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                        ,0x48a,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
        }
        uVar24 = iVar5 * 2 - uVar19;
        if (0x7f < uVar24) {
          pbVar22 = (byte *)((long)iVar6 + (long)__ptr);
          uVar23 = uVar24;
          do {
            *pbVar22 = (byte)uVar23 | 0x80;
            uVar24 = uVar23 >> 7;
            pbVar22 = pbVar22 + 1;
            iVar6 = iVar6 + 1;
            bVar3 = 0x3fff < uVar23;
            uVar23 = uVar24;
          } while (bVar3);
        }
        iVar5 = iVar6 + 1;
        *(char *)((long)__ptr + (long)iVar6) = (char)uVar24;
        uVar19 = uVar19 - uVar7;
        if (0x7f < uVar19) {
          pbVar22 = (byte *)((long)iVar5 + (long)__ptr);
          uVar7 = uVar19;
          do {
            *pbVar22 = (byte)uVar7 | 0x80;
            uVar19 = uVar7 >> 7;
            pbVar22 = pbVar22 + 1;
            iVar5 = iVar5 + 1;
            bVar3 = 0x3fff < uVar7;
            uVar7 = uVar19;
          } while (bVar3);
        }
        *(char *)((long)__ptr + (long)iVar5) = (char)uVar19;
        if (iVar17 * 8 + 0x5a <= iVar5) {
          puts(
              "Gia_AigerWrite(): AIGER generation has failed because the allocated buffer is too small."
              );
          fclose(__stream);
          if (p == pInit) {
            return;
          }
          goto LAB_00678d49;
        }
        iVar6 = iVar5 + 1;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != iVar4);
  }
  if (iVar18 <= iVar6) {
    __assert_fail("Pos < nBufferSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                  ,0x496,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
  }
  fwrite(__ptr,1,(long)iVar6,__stream);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if ((p->vNamesIn != (Vec_Ptr_t *)0x0) && (p->vNamesOut != (Vec_Ptr_t *)0x0)) {
    if (p->vNamesIn->nSize != p->vCis->nSize) {
      __assert_fail("Vec_PtrSize(p->vNamesIn) == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                    ,0x49f,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
    }
    if (p->vNamesOut->nSize != p->vCos->nSize) {
      __assert_fail("Vec_PtrSize(p->vNamesOut) == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                    ,0x4a0,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
    }
    pVVar8 = p->vCis;
    uVar13 = (ulong)(uint)pVVar8->nSize;
    if (p->nRegs < pVVar8->nSize) {
      uVar25 = 0;
      do {
        if ((long)(int)uVar13 <= (long)uVar25) goto LAB_00678da8;
        if ((pVVar8->pArray[uVar25] < 0) || (p->nObjs <= pVVar8->pArray[uVar25])) goto LAB_00678d89;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if ((long)p->vNamesIn->nSize <= (long)uVar25) goto LAB_00678de6;
        fprintf(__stream,"i%d %s\n",uVar25 & 0xffffffff,p->vNamesIn->pArray[uVar25]);
        uVar25 = uVar25 + 1;
        pVVar8 = p->vCis;
        uVar13 = (ulong)pVVar8->nSize;
      } while ((long)uVar25 < (long)(uVar13 - (long)p->nRegs));
    }
    iVar4 = p->nRegs;
    if (0 < iVar4) {
      uVar19 = 0;
      do {
        iVar17 = p->vCis->nSize;
        uVar7 = (iVar17 - iVar4) + uVar19;
        if (((int)uVar7 < 0) || (iVar17 <= (int)uVar7)) goto LAB_00678da8;
        iVar4 = p->vCis->pArray[uVar7];
        if ((iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00678d89;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (p->vNamesIn->nSize <= (int)uVar7) goto LAB_00678de6;
        fprintf(__stream,"l%d %s\n",(ulong)uVar19,p->vNamesIn->pArray[uVar7]);
        uVar19 = uVar19 + 1;
        iVar4 = p->nRegs;
      } while ((int)uVar19 < iVar4);
    }
    pVVar8 = p->vCos;
    uVar13 = (ulong)(uint)pVVar8->nSize;
    if (p->nRegs < pVVar8->nSize) {
      uVar25 = 0;
      do {
        if ((long)(int)uVar13 <= (long)uVar25) {
LAB_00678da8:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((pVVar8->pArray[uVar25] < 0) || (p->nObjs <= pVVar8->pArray[uVar25])) {
LAB_00678d89:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if ((long)p->vNamesOut->nSize <= (long)uVar25) {
LAB_00678de6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        fprintf(__stream,"o%d %s\n",uVar25 & 0xffffffff,p->vNamesOut->pArray[uVar25]);
        uVar25 = uVar25 + 1;
        pVVar8 = p->vCos;
        uVar13 = (ulong)pVVar8->nSize;
      } while ((long)uVar25 < (long)(uVar13 - (long)p->nRegs));
    }
  }
  fputc(99,__stream);
  if (p->pAigExtra != (Gia_Man_t *)0x0) {
    fputc(0x61,__stream);
    pVVar9 = Gia_AigerWriteIntoMemoryStr(p->pAigExtra);
    iVar4 = pVVar9->nSize;
    puVar16 = Buffer;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
    fwrite(pVVar9->pArray,1,(long)pVVar9->nSize,__stream);
    if (pVVar9->pArray != (char *)0x0) {
      free(pVVar9->pArray);
      pVVar9->pArray = (char *)0x0;
    }
    if (pVVar9 != (Vec_Str_t *)0x0) {
      free(pVVar9);
    }
  }
  if (p->nConstrs != 0) {
    fputc(99,__stream);
    puVar16 = Buffer;
    iVar4 = 0x18;
    do {
      *puVar16 = (uchar)(4 >> ((byte)iVar4 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar4 = iVar4 + -8;
    } while (iVar4 != -8);
    puVar16 = Buffer;
    fwrite(puVar16,1,4,__stream);
    iVar4 = p->nConstrs;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
  }
  if (p->nAnd2Delay != 0) {
    fputc(100,__stream);
    puVar16 = Buffer;
    iVar4 = 0x18;
    do {
      *puVar16 = (uchar)(4 >> ((byte)iVar4 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar4 = iVar4 + -8;
    } while (iVar4 != -8);
    puVar16 = Buffer;
    fwrite(puVar16,1,4,__stream);
    iVar4 = p->nAnd2Delay;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
  }
  if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
    pfVar10 = Tim_ManGetArrTimes((Tim_Man_t *)p->pManTime);
    if (pfVar10 != (float *)0x0) {
      fputc(0x69,__stream);
      iVar4 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
      puVar16 = Buffer;
      iVar17 = 0x18;
      do {
        *puVar16 = (uchar)((iVar4 << 2) >> ((byte)iVar17 & 0x1f));
        puVar16 = puVar16 + 1;
        iVar17 = iVar17 + -8;
      } while (iVar17 != -8);
      fwrite(Buffer,1,4,__stream);
      iVar4 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
      fwrite(pfVar10,1,(long)(iVar4 << 2),__stream);
      free(pfVar10);
    }
    pfVar10 = Tim_ManGetReqTimes((Tim_Man_t *)p->pManTime);
    if (pfVar10 != (float *)0x0) {
      fputc(0x6f,__stream);
      iVar4 = Tim_ManPoNum((Tim_Man_t *)p->pManTime);
      puVar16 = Buffer;
      iVar17 = 0x18;
      do {
        *puVar16 = (uchar)((iVar4 << 2) >> ((byte)iVar17 & 0x1f));
        puVar16 = puVar16 + 1;
        iVar17 = iVar17 + -8;
      } while (iVar17 != -8);
      fwrite(Buffer,1,4,__stream);
      iVar4 = Tim_ManPoNum((Tim_Man_t *)p->pManTime);
      fwrite(pfVar10,1,(long)(iVar4 << 2),__stream);
      free(pfVar10);
    }
  }
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) {
    fputc(0x65,__stream);
    pVVar9 = Gia_WriteEquivClasses(p);
    iVar4 = pVVar9->nSize;
    puVar16 = Buffer;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
    fwrite(pVVar9->pArray,1,(long)pVVar9->nSize,__stream);
    if (pVVar9->pArray != (char *)0x0) {
      free(pVVar9->pArray);
      pVVar9->pArray = (char *)0x0;
    }
    if (pVVar9 != (Vec_Str_t *)0x0) {
      free(pVVar9);
    }
  }
  if (p->vFlopClasses != (Vec_Int_t *)0x0) {
    fputc(0x66,__stream);
    iVar4 = p->nRegs;
    puVar16 = Buffer;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)((iVar4 << 2) >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
    if (p->vFlopClasses->nSize != p->nRegs) {
      __assert_fail("Vec_IntSize(p->vFlopClasses) == Gia_ManRegNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                    ,0x4ed,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
    }
    fwrite(p->vFlopClasses->pArray,1,(long)p->nRegs << 2,__stream);
  }
  if (p->vGateClasses != (Vec_Int_t *)0x0) {
    fputc(0x67,__stream);
    iVar4 = p->nObjs;
    puVar16 = Buffer;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)((iVar4 << 2) >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
    if (p->vGateClasses->nSize != p->nObjs) {
      __assert_fail("Vec_IntSize(p->vGateClasses) == Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                    ,0x4f5,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
    }
    fwrite(p->vGateClasses->pArray,1,(long)p->nObjs << 2,__stream);
  }
  if (p->pManTime != (void *)0x0) {
    fputc(0x68,__stream);
    pVVar9 = Tim_ManSave((Tim_Man_t *)p->pManTime,1);
    iVar4 = pVVar9->nSize;
    puVar16 = Buffer;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
    fwrite(pVVar9->pArray,1,(long)pVVar9->nSize,__stream);
    if (pVVar9->pArray != (char *)0x0) {
      free(pVVar9->pArray);
      pVVar9->pArray = (char *)0x0;
    }
    if (pVVar9 != (Vec_Str_t *)0x0) {
      free(pVVar9);
    }
  }
  if (p->vPacking != (Vec_Int_t *)0x0) {
    fputc(0x6b,__stream);
    pVVar9 = Gia_WritePacking(p->vPacking);
    iVar4 = pVVar9->nSize;
    puVar16 = Buffer;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
    fwrite(pVVar9->pArray,1,(long)pVVar9->nSize,__stream);
    if (pVVar9->pArray != (char *)0x0) {
      free(pVVar9->pArray);
      pVVar9->pArray = (char *)0x0;
    }
    if (pVVar9 != (Vec_Str_t *)0x0) {
      free(pVVar9);
    }
  }
  if (p->vEdge1 != (Vec_Int_t *)0x0) {
    pVVar8 = Gia_ManEdgeToArray(p);
    fputc(0x77,__stream);
    iVar4 = pVVar8->nSize;
    puVar16 = Buffer;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)(iVar4 * 4 + 4 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    puVar16 = Buffer;
    fwrite(puVar16,1,4,__stream);
    iVar4 = pVVar8->nSize;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)(iVar4 / 2 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
    if (0 < pVVar8->nSize) {
      lVar15 = 0;
      do {
        iVar4 = pVVar8->pArray[lVar15];
        iVar17 = 0x18;
        puVar16 = Buffer;
        do {
          *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
          puVar16 = puVar16 + 1;
          iVar17 = iVar17 + -8;
        } while (iVar17 != -8);
        fwrite(Buffer,1,4,__stream);
        lVar15 = lVar15 + 1;
      } while (lVar15 < pVVar8->nSize);
    }
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      pVVar8->pArray = (int *)0x0;
    }
    if (pVVar8 != (Vec_Int_t *)0x0) {
      free(pVVar8);
    }
  }
  if (p->vMapping != (Vec_Int_t *)0x0) {
    fputc(0x6d,__stream);
    pVVar9 = Gia_AigerWriteMappingDoc(p);
    iVar4 = pVVar9->nSize;
    puVar16 = Buffer;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
    fwrite(pVVar9->pArray,1,(long)pVVar9->nSize,__stream);
    if (pVVar9->pArray != (char *)0x0) {
      free(pVVar9->pArray);
      pVVar9->pArray = (char *)0x0;
    }
    if (pVVar9 != (Vec_Str_t *)0x0) {
      free(pVVar9);
    }
  }
  if (p->pPlacement != (Gia_Plc_t *)0x0) {
    fputc(0x70,__stream);
    iVar4 = p->nObjs;
    puVar16 = Buffer;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)((iVar4 << 2) >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
    fwrite(p->pPlacement,1,(long)p->nObjs << 2,__stream);
  }
  if (p->vRegClasses != (Vec_Int_t *)0x0) {
    fputc(0x72,__stream);
    iVar4 = p->vRegClasses->nSize;
    puVar16 = Buffer;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)(iVar4 * 4 + 4 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    puVar16 = Buffer;
    fwrite(puVar16,1,4,__stream);
    iVar4 = p->vRegClasses->nSize;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
    pVVar8 = p->vRegClasses;
    if (0 < pVVar8->nSize) {
      lVar15 = 0;
      do {
        iVar4 = pVVar8->pArray[lVar15];
        iVar17 = 0x18;
        puVar16 = Buffer;
        do {
          *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
          puVar16 = puVar16 + 1;
          iVar17 = iVar17 + -8;
        } while (iVar17 != -8);
        fwrite(Buffer,1,4,__stream);
        lVar15 = lVar15 + 1;
        pVVar8 = p->vRegClasses;
      } while (lVar15 < pVVar8->nSize);
    }
  }
  if (p->vRegInits != (Vec_Int_t *)0x0) {
    fputc(0x73,__stream);
    iVar4 = p->vRegInits->nSize;
    puVar16 = Buffer;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)(iVar4 * 4 + 4 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    puVar16 = Buffer;
    fwrite(puVar16,1,4,__stream);
    iVar4 = p->vRegInits->nSize;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
    pVVar8 = p->vRegInits;
    if (0 < pVVar8->nSize) {
      lVar15 = 0;
      do {
        iVar4 = pVVar8->pArray[lVar15];
        iVar17 = 0x18;
        puVar16 = Buffer;
        do {
          *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
          puVar16 = puVar16 + 1;
          iVar17 = iVar17 + -8;
        } while (iVar17 != -8);
        fwrite(Buffer,1,4,__stream);
        lVar15 = lVar15 + 1;
        pVVar8 = p->vRegInits;
      } while (lVar15 < pVVar8->nSize);
    }
  }
  if (p->vConfigs != (Vec_Int_t *)0x0) {
    fputc(0x62,__stream);
    if (p->pCellStr == (char *)0x0) {
      __assert_fail("p->pCellStr != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                    ,0x545,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
    }
    iVar4 = p->vConfigs->nSize;
    sVar11 = strlen(p->pCellStr);
    puVar16 = Buffer;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)((int)sVar11 + iVar4 * 4 + 1 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
    pcVar14 = p->pCellStr;
    sVar11 = strlen(pcVar14);
    fwrite(pcVar14,1,sVar11 + 1,__stream);
    pVVar8 = p->vConfigs;
    if (0 < pVVar8->nSize) {
      lVar15 = 0;
      do {
        iVar4 = pVVar8->pArray[lVar15];
        iVar17 = 0x18;
        puVar16 = Buffer;
        do {
          *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
          puVar16 = puVar16 + 1;
          iVar17 = iVar17 + -8;
        } while (iVar17 != -8);
        fwrite(Buffer,1,4,__stream);
        lVar15 = lVar15 + 1;
        pVVar8 = p->vConfigs;
      } while (lVar15 < pVVar8->nSize);
    }
  }
  if (p->pSibls != (int *)0x0) {
    fputc(0x71,__stream);
    if ((long)p->nObjs < 1) {
      uVar19 = 0;
    }
    else {
      lVar15 = 0;
      uVar19 = 0;
      do {
        uVar7 = 0;
        if (p->pSibls != (int *)0x0) {
          uVar7 = (uint)(0 < p->pSibls[lVar15]);
        }
        uVar19 = uVar19 + uVar7;
        lVar15 = lVar15 + 1;
      } while (p->nObjs != lVar15);
    }
    puVar16 = Buffer;
    iVar4 = 0x18;
    do {
      *puVar16 = (uchar)((int)(uVar19 * 8 + 4) >> ((byte)iVar4 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar4 = iVar4 + -8;
    } while (iVar4 != -8);
    puVar16 = Buffer;
    fwrite(puVar16,1,4,__stream);
    iVar4 = 0x18;
    do {
      *puVar16 = (uchar)(uVar19 >> ((byte)iVar4 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar4 = iVar4 + -8;
    } while (iVar4 != -8);
    fwrite(Buffer,1,4,__stream);
    if (0 < p->nObjs) {
      lVar15 = 0;
      do {
        piVar2 = p->pSibls;
        if ((piVar2 != (int *)0x0) && (piVar2[lVar15] != 0)) {
          if (piVar2 == (int *)0x0) {
            lVar12 = 0;
          }
          else {
            lVar12 = (long)piVar2[lVar15];
          }
          if (lVar15 <= lVar12) {
            __assert_fail("i > Gia_ObjSibl(p, i)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                          ,0x558,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
          }
          iVar4 = 0x18;
          puVar16 = Buffer;
          do {
            *puVar16 = (uchar)((uint)lVar15 >> ((byte)iVar4 & 0x1f));
            puVar16 = puVar16 + 1;
            iVar4 = iVar4 + -8;
          } while (iVar4 != -8);
          fwrite(Buffer,1,4,__stream);
          if (p->pSibls == (int *)0x0) {
            iVar4 = 0;
          }
          else {
            iVar4 = p->pSibls[lVar15];
          }
          iVar17 = 0x18;
          puVar16 = Buffer;
          do {
            *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
            puVar16 = puVar16 + 1;
            iVar17 = iVar17 + -8;
          } while (iVar17 != -8);
          fwrite(Buffer,1,4,__stream);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < p->nObjs);
    }
  }
  if (p->pSwitching != (uchar *)0x0) {
    fputc(0x75,__stream);
    iVar4 = p->nObjs;
    puVar16 = Buffer;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)(iVar4 >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
    fwrite(p->pSwitching,1,(long)p->nObjs,__stream);
  }
  if (p->vObjClasses != (Vec_Int_t *)0x0) {
    fputc(0x76,__stream);
    iVar4 = p->nObjs;
    puVar16 = Buffer;
    iVar17 = 0x18;
    do {
      *puVar16 = (uchar)((iVar4 << 2) >> ((byte)iVar17 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar17 = iVar17 + -8;
    } while (iVar17 != -8);
    fwrite(Buffer,1,4,__stream);
    if (p->vObjClasses->nSize != p->nObjs) {
      __assert_fail("Vec_IntSize(p->vObjClasses) == Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                    ,0x575,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
    }
    fwrite(p->vObjClasses->pArray,1,(long)p->nObjs << 2,__stream);
  }
  if (p->pName != (char *)0x0) {
    fputc(0x6e,__stream);
    sVar11 = strlen(p->pName);
    puVar16 = Buffer;
    iVar4 = 0x18;
    do {
      *puVar16 = (uchar)((int)sVar11 + 1 >> ((byte)iVar4 & 0x1f));
      puVar16 = puVar16 + 1;
      iVar4 = iVar4 + -8;
    } while (iVar4 != -8);
    fwrite(Buffer,1,4,__stream);
    pcVar14 = p->pName;
    sVar11 = strlen(pcVar14);
    fwrite(pcVar14,1,sVar11,__stream);
    fputc(0,__stream);
  }
  pcVar14 = Gia_TimeStamp();
  fprintf(__stream,"\nThis file was produced by the GIA package in ABC on %s\n",pcVar14);
  fprintf(__stream,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger");
  fclose(__stream);
  if (p == pInit) {
    return;
  }
  pInit->pManTime = p->pManTime;
  p->pManTime = (void *)0x0;
  pInit->vNamesIn = p->vNamesIn;
  p->vNamesIn = (Vec_Ptr_t *)0x0;
  pInit->vNamesOut = p->vNamesOut;
  p->vNamesOut = (Vec_Ptr_t *)0x0;
LAB_00678d49:
  Gia_ManStop(p);
  return;
}

Assistant:

void Gia_AigerWrite( Gia_Man_t * pInit, char * pFileName, int fWriteSymbols, int fCompact )
{
    int fVerbose = XAIG_VERBOSE;
    FILE * pFile;
    Gia_Man_t * p;
    Gia_Obj_t * pObj;
    Vec_Str_t * vStrExt;
    int i, nBufferSize, Pos;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;
    assert( pInit->nXors == 0 && pInit->nMuxes == 0 );

    if ( Gia_ManCoNum(pInit) == 0 )
    {
        printf( "AIG cannot be written because it has no POs.\n" );
        return;
    }

    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Gia_AigerWrite(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    // create normalized AIG
    if ( !Gia_ManIsNormalized(pInit) )
    {
//        printf( "Gia_AigerWrite(): Normalizing AIG for writing.\n" );
        p = Gia_ManDupNormalize( pInit, 0 );
		Gia_ManTransferMapping( p, pInit );
	    Gia_ManTransferPacking( p, pInit );
        Gia_ManTransferTiming( p, pInit );
        p->vNamesIn   = pInit->vNamesIn;   pInit->vNamesIn   = NULL;
        p->vNamesOut  = pInit->vNamesOut;  pInit->vNamesOut  = NULL;
        p->nConstrs   = pInit->nConstrs;   pInit->nConstrs   = 0;
    }
    else
        p = pInit;

    // write the header "M I L O A" where M = I + L + A
    fprintf( pFile, "aig%s %u %u %u %u %u", 
        fCompact? "2" : "",
        Gia_ManCiNum(p) + Gia_ManAndNum(p), 
        Gia_ManPiNum(p),
        Gia_ManRegNum(p),
        Gia_ManConstrNum(p) ? 0 : Gia_ManPoNum(p),
        Gia_ManAndNum(p) );
    // write the extended header "B C J F"
    if ( Gia_ManConstrNum(p) )
        fprintf( pFile, " %u %u", Gia_ManPoNum(p) - Gia_ManConstrNum(p), Gia_ManConstrNum(p) );
    fprintf( pFile, "\n" ); 

    Gia_ManInvertConstraints( p );
    if ( !fCompact ) 
    {
        // write latch drivers
        Gia_ManForEachRi( p, pObj, i )
            fprintf( pFile, "%u\n", Gia_ObjFaninLit0p(p, pObj) );
        // write PO drivers
        Gia_ManForEachPo( p, pObj, i )
            fprintf( pFile, "%u\n", Gia_ObjFaninLit0p(p, pObj) );
    }
    else
    {
        Vec_Int_t * vLits = Gia_AigerCollectLiterals( p );
        Vec_Str_t * vBinary = Gia_AigerWriteLiterals( vLits );
        fwrite( Vec_StrArray(vBinary), 1, Vec_StrSize(vBinary), pFile );
        Vec_StrFree( vBinary );
        Vec_IntFree( vLits );
    }
    Gia_ManInvertConstraints( p );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 8 * Gia_ManAndNum(p) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
    Gia_ManForEachAnd( p, pObj, i )
    {
        uLit  = Abc_Var2Lit( i, 0 );
        uLit0 = Gia_ObjFaninLit0( pObj, i );
        uLit1 = Gia_ObjFaninLit1( pObj, i );
        assert( p->fGiaSimple || Gia_ManBufNum(p) || uLit0 < uLit1 );
        Pos = Gia_AigerWriteUnsignedBuffer( pBuffer, Pos, uLit  - uLit1 );
        Pos = Gia_AigerWriteUnsignedBuffer( pBuffer, Pos, uLit1 - uLit0 );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Gia_AigerWrite(): AIGER generation has failed because the allocated buffer is too small.\n" );
	        fclose( pFile );
            if ( p != pInit )
                Gia_ManStop( p );
            return;
        }
    }
    assert( Pos < nBufferSize );

    // write the buffer
    fwrite( pBuffer, 1, Pos, pFile );
    ABC_FREE( pBuffer );

    // write the symbol table
    if ( p->vNamesIn && p->vNamesOut )
    {
        assert( Vec_PtrSize(p->vNamesIn)  == Gia_ManCiNum(p) );
        assert( Vec_PtrSize(p->vNamesOut) == Gia_ManCoNum(p) );
        // write PIs
        Gia_ManForEachPi( p, pObj, i )
            fprintf( pFile, "i%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesIn, i) );
        // write latches
        Gia_ManForEachRo( p, pObj, i )
            fprintf( pFile, "l%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesIn, Gia_ManPiNum(p) + i) );
        // write POs
        Gia_ManForEachPo( p, pObj, i )
            fprintf( pFile, "o%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesOut, i) );
    }

    // write the comment
//    fprintf( pFile, "c\n" );
    fprintf( pFile, "c" );

    // write additional AIG
    if ( p->pAigExtra )
    {
        fprintf( pFile, "a" );
        vStrExt = Gia_AigerWriteIntoMemoryStr( p->pAigExtra );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"a\".\n" );
    }
    // write constraints
    if ( p->nConstrs )
    {
        fprintf( pFile, "c" );
        Gia_FileWriteBufferSize( pFile, 4 );
        Gia_FileWriteBufferSize( pFile, p->nConstrs );
    }
    // write timing information
    if ( p->nAnd2Delay )
    {
        fprintf( pFile, "d" );
        Gia_FileWriteBufferSize( pFile, 4 );
        Gia_FileWriteBufferSize( pFile, p->nAnd2Delay );
    }
    if ( p->pManTime )
    {
        float * pTimes;
        pTimes = Tim_ManGetArrTimes( (Tim_Man_t *)p->pManTime );
        if ( pTimes )
        {
            fprintf( pFile, "i" );
            Gia_FileWriteBufferSize( pFile, 4*Tim_ManPiNum((Tim_Man_t *)p->pManTime) );
            fwrite( pTimes, 1, 4*Tim_ManPiNum((Tim_Man_t *)p->pManTime), pFile );
            ABC_FREE( pTimes );
            if ( fVerbose ) printf( "Finished writing extension \"i\".\n" );
        }
        pTimes = Tim_ManGetReqTimes( (Tim_Man_t *)p->pManTime );
        if ( pTimes )
        {
            fprintf( pFile, "o" );
            Gia_FileWriteBufferSize( pFile, 4*Tim_ManPoNum((Tim_Man_t *)p->pManTime) );
            fwrite( pTimes, 1, 4*Tim_ManPoNum((Tim_Man_t *)p->pManTime), pFile );
            ABC_FREE( pTimes );
            if ( fVerbose ) printf( "Finished writing extension \"o\".\n" );
        }
    }
    // write equivalences
    if ( p->pReprs && p->pNexts )
    {
        extern Vec_Str_t * Gia_WriteEquivClasses( Gia_Man_t * p );
        fprintf( pFile, "e" );
        vStrExt = Gia_WriteEquivClasses( p );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
    }
    // write flop classes
    if ( p->vFlopClasses )
    {
        fprintf( pFile, "f" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManRegNum(p) );
        assert( Vec_IntSize(p->vFlopClasses) == Gia_ManRegNum(p) );
        fwrite( Vec_IntArray(p->vFlopClasses), 1, 4*Gia_ManRegNum(p), pFile );
    }
    // write gate classes
    if ( p->vGateClasses )
    {
        fprintf( pFile, "g" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        assert( Vec_IntSize(p->vGateClasses) == Gia_ManObjNum(p) );
        fwrite( Vec_IntArray(p->vGateClasses), 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write hierarchy info
    if ( p->pManTime )
    {
        fprintf( pFile, "h" );
        vStrExt = Tim_ManSave( (Tim_Man_t *)p->pManTime, 1 );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"h\".\n" );
    }
    // write packing
    if ( p->vPacking )
    {
        extern Vec_Str_t * Gia_WritePacking( Vec_Int_t * vPacking );
        fprintf( pFile, "k" );
        vStrExt = Gia_WritePacking( p->vPacking );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"k\".\n" );
    }
    // write edges
    if ( p->vEdge1 )
    {
        Vec_Int_t * vPairs = Gia_ManEdgeToArray( p );
        int i;
        fprintf( pFile, "w" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(vPairs)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(vPairs)/2 );
        for ( i = 0; i < Vec_IntSize(vPairs); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(vPairs, i) );
        Vec_IntFree( vPairs );
    }
    // write mapping
    if ( Gia_ManHasMapping(p) )
    {
        extern Vec_Str_t * Gia_AigerWriteMapping( Gia_Man_t * p );
        extern Vec_Str_t * Gia_AigerWriteMappingSimple( Gia_Man_t * p );
        extern Vec_Str_t * Gia_AigerWriteMappingDoc( Gia_Man_t * p );
        fprintf( pFile, "m" );
        vStrExt = Gia_AigerWriteMappingDoc( p );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"m\".\n" );
    }
    // write placement
    if ( p->pPlacement )
    {
        fprintf( pFile, "p" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        fwrite( p->pPlacement, 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write register classes
    if ( p->vRegClasses )
    {
        int i;
        fprintf( pFile, "r" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(p->vRegClasses)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(p->vRegClasses) );
        for ( i = 0; i < Vec_IntSize(p->vRegClasses); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vRegClasses, i) );
    }
    // write register inits
    if ( p->vRegInits )
    {
        int i;
        fprintf( pFile, "s" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(p->vRegInits)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(p->vRegInits) );
        for ( i = 0; i < Vec_IntSize(p->vRegInits); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vRegInits, i) );
    }
    // write configuration data
    if ( p->vConfigs )
    {
        fprintf( pFile, "b" );
        assert( p->pCellStr != NULL );
        Gia_FileWriteBufferSize( pFile, 4*Vec_IntSize(p->vConfigs) + strlen(p->pCellStr) + 1 );
        fwrite( p->pCellStr, 1, strlen(p->pCellStr) + 1, pFile );
//        fwrite( Vec_IntArray(p->vConfigs), 1, 4*Vec_IntSize(p->vConfigs), pFile );
        for ( i = 0; i < Vec_IntSize(p->vConfigs); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vConfigs, i) );
    }
    // write choices
    if ( Gia_ManHasChoices(p) )
    {
        int i, nPairs = 0;
        fprintf( pFile, "q" );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            nPairs += (Gia_ObjSibl(p, i) > 0);
        Gia_FileWriteBufferSize( pFile, 4*(nPairs * 2 + 1) );
        Gia_FileWriteBufferSize( pFile, nPairs );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( Gia_ObjSibl(p, i) )
            {
                assert( i > Gia_ObjSibl(p, i) );
                Gia_FileWriteBufferSize( pFile, i );
                Gia_FileWriteBufferSize( pFile, Gia_ObjSibl(p, i) );
            }
        if ( fVerbose ) printf( "Finished writing extension \"q\".\n" );
    }
    // write switching activity
    if ( p->pSwitching )
    {
        fprintf( pFile, "u" );
        Gia_FileWriteBufferSize( pFile, Gia_ManObjNum(p) );
        fwrite( p->pSwitching, 1, Gia_ManObjNum(p), pFile );
    }
/*
    // write timing information
    if ( p->pManTime )
    {
        fprintf( pFile, "t" );
        vStrExt = Tim_ManSave( (Tim_Man_t *)p->pManTime, 0 );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
    }
*/
    // write object classes
    if ( p->vObjClasses )
    {
        fprintf( pFile, "v" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        assert( Vec_IntSize(p->vObjClasses) == Gia_ManObjNum(p) );
        fwrite( Vec_IntArray(p->vObjClasses), 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write name
    if ( p->pName )
    {
        fprintf( pFile, "n" );
        Gia_FileWriteBufferSize( pFile, strlen(p->pName)+1 );
        fwrite( p->pName, 1, strlen(p->pName), pFile );
        fprintf( pFile, "%c", '\0' );
    }
    // write comments
    fprintf( pFile, "\nThis file was produced by the GIA package in ABC on %s\n", Gia_TimeStamp() );
    fprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
	fclose( pFile );
    if ( p != pInit )
    {
        pInit->pManTime  = p->pManTime;  p->pManTime = NULL;
        pInit->vNamesIn  = p->vNamesIn;  p->vNamesIn = NULL;
        pInit->vNamesOut = p->vNamesOut; p->vNamesOut = NULL;
        Gia_ManStop( p );
    }
}